

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O2

bool bssl::der::anon_unknown_3::DecimalStringToUint<unsigned_short>
               (ByteReader *in,size_t digits,unsigned_short *out)

{
  bool bVar1;
  undefined8 in_RAX;
  unsigned_short uVar2;
  ulong uVar3;
  uint8_t digit;
  undefined8 uStack_38;
  
  uVar2 = 0;
  uStack_38 = in_RAX;
  for (uVar3 = 0; digits != uVar3; uVar3 = uVar3 + 1) {
    bVar1 = ByteReader::ReadByte(in,(uint8_t *)((long)&uStack_38 + 7));
    if ((!bVar1) || ((byte)(uStack_38._7_1_ - 0x3a) < 0xf6)) goto LAB_0037f931;
    uVar2 = (uVar2 * 10 + (ushort)uStack_38._7_1_) - 0x30;
  }
  *out = uVar2;
LAB_0037f931:
  return digits <= uVar3;
}

Assistant:

bool DecimalStringToUint(ByteReader &in, size_t digits, UINT *out) {
  UINT value = 0;
  for (size_t i = 0; i < digits; ++i) {
    uint8_t digit;
    if (!in.ReadByte(&digit)) {
      return false;
    }
    if (digit < '0' || digit > '9') {
      return false;
    }
    value = (value * 10) + (digit - '0');
  }
  *out = value;
  return true;
}